

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

bool __thiscall llvm::ItaniumPartialDemangler::isCtorOrDtor(ItaniumPartialDemangler *this)

{
  char cVar1;
  void *pvVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  
  lVar3 = 0x10;
  lVar4 = 0x18;
  while( true ) {
    pvVar2 = this->RootNode;
    if (pvVar2 == (void *)0x0) {
      return false;
    }
    cVar1 = *(char *)((long)pvVar2 + 8);
    lVar5 = lVar3;
    if ((((cVar1 != '\b') && (lVar5 = lVar4, cVar1 != '\x12')) && (cVar1 != '\x17')) &&
       (((cVar1 != '\x18' && (lVar5 = lVar3, cVar1 != '\x1f')) && (cVar1 != '!')))) break;
    this = (ItaniumPartialDemangler *)((long)pvVar2 + lVar5);
  }
  if (cVar1 != '$') {
    return false;
  }
  return true;
}

Assistant:

bool ItaniumPartialDemangler::isCtorOrDtor() const {
  Node *N = static_cast<Node *>(RootNode);
  while (N) {
    switch (N->getKind()) {
    default:
      return false;
    case Node::KCtorDtorName:
      return true;

    case Node::KAbiTagAttr:
      N = static_cast<AbiTagAttr *>(N)->Base;
      break;
    case Node::KFunctionEncoding:
      N = static_cast<FunctionEncoding *>(N)->getName();
      break;
    case Node::KLocalName:
      N = static_cast<LocalName *>(N)->Entity;
      break;
    case Node::KNameWithTemplateArgs:
      N = static_cast<NameWithTemplateArgs *>(N)->Name;
      break;
    case Node::KNestedName:
      N = static_cast<NestedName *>(N)->Name;
      break;
    case Node::KStdQualifiedName:
      N = static_cast<StdQualifiedName *>(N)->Child;
      break;
    }
  }
  return false;
}